

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall
QDomElementPrivate::setAttribute(QDomElementPrivate *this,QString *aname,QString *newValue)

{
  QDomNodePrivate *this_00;
  QDomNodePrivate *parent;
  QDomNamedNodeMapPrivate *in_RDX;
  QDomNamedNodeMapPrivate *in_RSI;
  QDomDocumentPrivate *in_RDI;
  QDomNodePrivate *n;
  QDomNodePrivate *in_stack_00000048;
  QString *in_stack_ffffffffffffffc8;
  QString *in_stack_ffffffffffffffe0;
  
  this_00 = QDomNamedNodeMapPrivate::namedItem(in_RDX,in_stack_ffffffffffffffe0);
  if (this_00 == (QDomNodePrivate *)0x0) {
    parent = (QDomNodePrivate *)operator_new(0xa8);
    QDomNodePrivate::ownerDocument(&in_RDI->super_QDomNodePrivate);
    QDomAttrPrivate::QDomAttrPrivate
              ((QDomAttrPrivate *)this_00,in_RDI,parent,in_stack_ffffffffffffffc8);
    (*parent->_vptr_QDomNodePrivate[2])(parent,in_RDX);
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x115f67);
    QDomNamedNodeMapPrivate::setNamedItem(in_RSI,in_stack_00000048);
  }
  else {
    (*this_00->_vptr_QDomNodePrivate[2])(this_00,in_RDX);
  }
  return;
}

Assistant:

void QDomElementPrivate::setAttribute(const QString& aname, const QString& newValue)
{
    QDomNodePrivate* n = m_attr->namedItem(aname);
    if (!n) {
        n = new QDomAttrPrivate(ownerDocument(), this, aname);
        n->setNodeValue(newValue);

        // Referencing is done by the map, so we set the reference counter back
        // to 0 here. This is ok since we created the QDomAttrPrivate.
        n->ref.deref();
        m_attr->setNamedItem(n);
    } else {
        n->setNodeValue(newValue);
    }
}